

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

string * __thiscall polyscope::SurfaceMesh::typeName_abi_cxx11_(SurfaceMesh *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)structureTypeName_abi_cxx11_);
  return in_RDI;
}

Assistant:

std::string SurfaceMesh::typeName() { return structureTypeName; }